

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

vector<CKeyID,_std::allocator<CKeyID>_> *
wallet::GetAffectedKeys
          (vector<CKeyID,_std::allocator<CKeyID>_> *__return_storage_ptr__,CScript *spk,
          SigningProvider *provider)

{
  pointer *ppCVar1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> dummy;
  FlatSigningProvider out;
  undefined1 local_140 [24];
  undefined8 local_128;
  undefined **local_118;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_110;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_e0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  _Stack_b0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_80;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_128 = 0;
  local_140._8_8_ = 0;
  local_140._16_8_ = 0;
  local_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_110._M_impl.super__Rb_tree_header._M_header;
  local_118 = &PTR__FlatSigningProvider_00b409b0;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_e0._M_impl.super__Rb_tree_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_b0._M_impl.super__Rb_tree_header._M_header;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right =
       local_110._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  InferDescriptor((CScript *)local_140,(SigningProvider *)spk);
  (**(code **)(*(long *)local_140._0_8_ + 0x40))
            (local_140._0_8_,0,DUMMY_SIGNING_PROVIDER,local_140 + 8,&local_118,0);
  if ((long *)local_140._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_140._0_8_ + 8))();
  }
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CKeyID,_std::allocator<CKeyID>_>::reserve
            (__return_storage_ptr__,local_e0._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var4 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var2;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CKeyID,std::allocator<CKeyID>>::_M_realloc_insert<CKeyID_const&>
                ((vector<CKeyID,std::allocator<CKeyID>> *)__return_storage_ptr__,__position,
                 (CKeyID *)(p_Var4 + 1));
    }
    else {
      *(undefined4 *)
       (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
           *(undefined4 *)&p_Var4[1]._M_left;
      p_Var3 = p_Var4[1]._M_parent;
      *(undefined8 *)((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems
           = *(undefined8 *)(p_Var4 + 1);
      *(_Base_ptr *)
       (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) = p_Var3
      ;
      ppCVar1 = &(__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
  }
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&_Stack_b0);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_e0);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_110);
  std::vector<CScript,_std::allocator<CScript>_>::~vector
            ((vector<CScript,_std::allocator<CScript>_> *)(local_140 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CKeyID> GetAffectedKeys(const CScript& spk, const SigningProvider& provider)
{
    std::vector<CScript> dummy;
    FlatSigningProvider out;
    InferDescriptor(spk, provider)->Expand(0, DUMMY_SIGNING_PROVIDER, dummy, out);
    std::vector<CKeyID> ret;
    ret.reserve(out.pubkeys.size());
    for (const auto& entry : out.pubkeys) {
        ret.push_back(entry.first);
    }
    return ret;
}